

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O3

NodeList * __thiscall lunasvg::Element::children(NodeList *__return_storage_ptr__,Element *this)

{
  SVGNode *pSVar1;
  SVGElement *pSVar2;
  Node local_28;
  
  pSVar1 = (this->super_Node).m_node;
  if (pSVar1 == (SVGNode *)0x0) {
    (__return_storage_ptr__->super__Vector_base<lunasvg::Node,_std::allocator<lunasvg::Node>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<lunasvg::Node,_std::allocator<lunasvg::Node>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<lunasvg::Node,_std::allocator<lunasvg::Node>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->super__Vector_base<lunasvg::Node,_std::allocator<lunasvg::Node>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<lunasvg::Node,_std::allocator<lunasvg::Node>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<lunasvg::Node,_std::allocator<lunasvg::Node>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (pSVar2 = pSVar1[3].m_parentElement; pSVar2 != (SVGElement *)&pSVar1[3].m_parentElement;
        pSVar2 = (SVGElement *)(pSVar2->super_SVGNode)._vptr_SVGNode) {
      local_28.m_node = &((pSVar2->super_SVGNode).m_parentElement)->super_SVGNode;
      std::vector<lunasvg::Node,_std::allocator<lunasvg::Node>_>::emplace_back<lunasvg::Node>
                (__return_storage_ptr__,&local_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NodeList Element::children() const
{
    if(m_node == nullptr)
        return NodeList();
    NodeList children;
    for(const auto& child : element()->children())
        children.push_back(child.get());
    return children;
}